

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_true,_true>::fix_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  int *piVar1;
  uint uVar2;
  pointer pBVar3;
  Bc BVar4;
  pointer pBVar5;
  pointer pBVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = node_pos >> 8;
  pBVar6 = (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar5 = (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while ((uint)((ulong)((long)pBVar5 - (long)pBVar6) >> 4) <= uVar9) {
    push_block_(this);
    pBVar6 = (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar5 = (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  this->bc_emps_ = this->bc_emps_ - 1;
  piVar1 = (int *)((long)&((blocks->
                           super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                           _M_impl.super__Vector_impl_data._M_start)->num_emps + (ulong)(uVar9 << 4)
                  );
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    uVar2 = *(uint *)((long)&pBVar6->next + (ulong)(uVar9 << 4));
    if (uVar2 == uVar9) {
      this->head_pos_ = 0xffffffff;
    }
    else {
      if (this->head_pos_ == uVar9) {
        this->head_pos_ = uVar2;
      }
      uVar9 = *(uint *)((long)&pBVar6->prev + (ulong)(uVar9 << 4));
      pBVar6[uVar9].next = uVar2;
      pBVar6[uVar2].prev = uVar9;
    }
  }
  else {
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    BVar4 = pBVar3[node_pos];
    uVar7 = (ulong)BVar4 >> 0x20 & 0x7fffffff;
    uVar8 = (ulong)BVar4 & 0x7fffffff;
    *(int *)(pBVar3 + uVar7) = (int)uVar8;
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar3[uVar8] = (Bc)((ulong)pBVar3[uVar8] & 0x80000000ffffffff | uVar7 << 0x20);
    pBVar6 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(uint32_t *)((long)&pBVar6->head + (ulong)(uVar9 << 4)) == node_pos) {
      *(uint *)((long)&pBVar6->head + (ulong)(uVar9 << 4)) = BVar4._0_4_ & 0x7fffffff;
    }
  }
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar3 = (Bc)((ulong)*pBVar3 | 0x8000000000000000);
  return;
}

Assistant:

void fix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (blocks[block_pos].num_emps == 0) {
      delete_block_link_(block_pos, blocks_);
    } else {
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
      if (node_pos == blocks[block_pos].head) {
        blocks[block_pos].head = next;
      }
    }
    bc_[node_pos].fix();
  }